

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-impl.cpp
# Opt level: O0

string * llama_format_tensor_shape_abi_cxx11_(ggml_tensor *t)

{
  size_t sVar1;
  size_t sVar2;
  long in_RSI;
  string *in_RDI;
  int i;
  char buf [256];
  undefined4 in_stack_fffffffffffffee0;
  int iVar3;
  char *in_stack_fffffffffffffee8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffef0;
  
  snprintf(&stack0xfffffffffffffee8,0x100,"%5ld",*(undefined8 *)(in_RSI + 0x10));
  for (iVar3 = 1; iVar3 < 4; iVar3 = iVar3 + 1) {
    sVar1 = strlen(&stack0xfffffffffffffee8);
    sVar2 = strlen(&stack0xfffffffffffffee8);
    snprintf(&stack0xfffffffffffffee8 + sVar1,0x100 - sVar2,", %5ld",
             *(undefined8 *)(in_RSI + 0x10 + (long)iVar3 * 8));
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,
             (allocator<char> *)CONCAT44(iVar3,in_stack_fffffffffffffee0));
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffee3);
  return in_RDI;
}

Assistant:

std::string llama_format_tensor_shape(const struct ggml_tensor * t) {
    char buf[256];
    snprintf(buf, sizeof(buf), "%5" PRId64, t->ne[0]);
    for (int i = 1; i < GGML_MAX_DIMS; i++) {
        snprintf(buf + strlen(buf), sizeof(buf) - strlen(buf), ", %5" PRId64, t->ne[i]);
    }
    return buf;
}